

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O1

Members * __thiscall qpdf::Stream::stream(Stream *this)

{
  QPDF_Stream *pQVar1;
  logic_error *this_00;
  _Head_base<0UL,_QPDF_Stream::Members_*,_false> in_RCX;
  code *pcVar2;
  undefined *puVar3;
  
  pQVar1 = BaseHandle::as<QPDF_Stream>(&this->super_BaseHandle);
  if ((pQVar1 == (QPDF_Stream *)0x0) ||
     (in_RCX._M_head_impl =
           (pQVar1->m)._M_t.
           super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>
           .super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl,
     in_RCX._M_head_impl != (Members *)0x0)) {
    if (pQVar1 != (QPDF_Stream *)0x0) {
      return in_RCX._M_head_impl;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              ((runtime_error *)this_00,"operation for stream attempted on non-stream object");
    puVar3 = &std::runtime_error::typeinfo;
    pcVar2 = std::runtime_error::~runtime_error;
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF_Stream: unexpected nullptr");
    puVar3 = &std::logic_error::typeinfo;
    pcVar2 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar3,pcVar2);
}

Assistant:

QPDF_Stream::Members*
        stream() const
        {
            if (auto s = as<QPDF_Stream>()) {
                if (auto ptr = s->m.get()) {
                    return ptr;
                }
                throw std::logic_error("QPDF_Stream: unexpected nullptr");
            }
            throw std::runtime_error("operation for stream attempted on non-stream object");
            return nullptr; // unreachable
        }